

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::VirtualNgon::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          VirtualNgon *this,Vector3d *position)

{
  pointer puVar1;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *poVar2;
  DenseStorage<double,__1,__1,_1,_0> *other;
  pointer puVar3;
  DenseStorage<double,__1,__1,_1,_0> local_1a8;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_198;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> pv;
  Vector3d local_178;
  Type local_160;
  Type local_128;
  Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
  local_f0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>_>
  local_b0;
  
  puVar3 = (this->_regions).
           super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->_regions).
           super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_198 = __return_storage_ptr__;
  while( true ) {
    if (puVar3 == puVar1) {
      (local_198->super_type).m_initialized = false;
      return local_198;
    }
    local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
           .array[2];
    local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
           .array[0];
    local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
           .array[1];
    RegionHandler::handleRemap
              ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&pv.super_type,
               (puVar3->_M_t).
               super___uniq_ptr_impl<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>.
               _M_t.
               super__Tuple_impl<0UL,_ear::RegionHandler_*,_std::default_delete<ear::RegionHandler>_>
               .super__Head_base<0UL,_ear::RegionHandler_*,_false>._M_head_impl,&local_178,
               (int)(this->_centreDownmix).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               + 1);
    if (pv.super_type.m_initialized == true) break;
    boost::optional_detail::optional_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional_base
              (&pv.super_type);
    puVar3 = puVar3 + 1;
  }
  other = (DenseStorage<double,__1,__1,_1,_0> *)
          boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get(&pv);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_1a8,other);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
            (&local_128,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1a8,
             local_1a8.m_rows + -1);
  poVar2 = local_198;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<int>
            (&local_160,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1a8,1);
  Eigen::
  Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
  ::Product(&local_f0,&this->_centreDownmix,
            &local_160.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+
            (&local_b0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&local_128,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>_>
              *)&local_f0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>const,Eigen::Product<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,0>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_1a8,&local_b0);
  local_b0.m_lhs.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
  .super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_data =
       (PointerType)
       Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                 ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1a8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1a8,(Scalar *)&local_b0);
  (poVar2->super_type).m_storage.dummy_.aligner_ = (type)local_1a8.m_data;
  *(Index *)((long)&(poVar2->super_type).m_storage.dummy_ + 8) = local_1a8.m_rows;
  (poVar2->super_type).m_initialized = true;
  boost::optional_detail::optional_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional_base
            (&pv.super_type);
  return poVar2;
}

Assistant:

boost::optional<Eigen::VectorXd> VirtualNgon::handle(
      Eigen::Vector3d position) const {
    for (const auto& region : _regions) {
      boost::optional<Eigen::VectorXd> pv = region->handleRemap(
          position, static_cast<int>(_centreDownmix.size() + 1));
      if (pv) {
        // downmix the last channel containing the virtual centre
        // speaker into the real speakers, and renormalise
        Eigen::VectorXd _pv = pv.get();
        _pv = _pv.head(_pv.size() - 1) + _centreDownmix * _pv.tail(1);
        _pv /= _pv.norm();
        return _pv;
      }
    }
    return boost::none;
  }